

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-ast.c
# Opt level: O1

ztast_intarrayinner_t *
ztast_intarrayinner_append(ztast_t *ast,ztast_intarrayinner_t *inner,int val)

{
  int iVar1;
  uint *__dest;
  ulong uVar2;
  
  if (inner == (ztast_intarrayinner_t *)0x0) {
    inner = (ztast_intarrayinner_t *)(*ast->mallocfn)(0x10,ast->opaque);
    if (inner == (ztast_intarrayinner_t *)0x0) {
      return (ztast_intarrayinner_t *)0x0;
    }
    inner->nused = 0;
    inner->nallocated = 0;
    inner->ints = (uint *)0x0;
  }
  iVar1 = inner->nallocated;
  if (inner->nused != iVar1) {
LAB_0010294a:
    iVar1 = inner->nused;
    inner->nused = iVar1 + 1;
    inner->ints[iVar1] = val;
    return inner;
  }
  uVar2 = 8;
  if (7 < iVar1) {
    uVar2 = (ulong)(uint)(iVar1 * 2);
  }
  __dest = (uint *)(*ast->mallocfn)(uVar2 * 4,ast->opaque);
  if (__dest != (uint *)0x0) {
    memcpy(__dest,inner->ints,(long)inner->nallocated << 2);
    if (ast->freefn != (ztast_freefn_t *)0x0) {
      (*ast->freefn)(inner->ints,ast->opaque);
    }
    inner->nallocated = (int)uVar2;
    inner->ints = __dest;
    if (__dest != (uint *)0x0) goto LAB_0010294a;
  }
  return (ztast_intarrayinner_t *)0x0;
}

Assistant:

ztast_intarrayinner_t *ztast_intarrayinner_append(ztast_t               *ast,
                                                  ztast_intarrayinner_t *inner,
                                                  int                    val)
{
  assert(ast);
  /* inner may be NULL - which means allocate */

#ifdef ZTAST_LOG
  if (ast->logfn)
    ast->logfn("ztast_intarrayinner_append\n");
#endif

  if (inner == NULL)
  {
    inner = ZTAST_MALLOC(sizeof(*inner));
    if (inner == NULL)
      return NULL;

    inner->nused      = 0;
    inner->nallocated = 0;
    inner->ints       = NULL;
  }

  if (inner->nused == inner->nallocated)
  {
    int           newarrlen;
    unsigned int *newarr;

    /* This code pattern would use realloc() normally but our simple memory
     * manager doesn't currently feature it. */

    newarrlen = inner->nallocated < 8 ? 8 : inner->nallocated * 2;
    newarr = ZTAST_MALLOC(newarrlen * sizeof(*newarr));
    if (newarr == NULL)
      return NULL;

    memcpy(newarr, inner->ints, inner->nallocated * sizeof(*newarr));
    ZTAST_FREE(inner->ints);

    inner->nallocated = newarrlen;
    inner->ints       = newarr;
  }

  inner->ints[inner->nused++] = val;

  return inner;
}